

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O0

void __thiscall
Js::AsmJsFunctionDeclaration::AsmJsFunctionDeclaration
          (AsmJsFunctionDeclaration *this,PropertyName name,SymbolType type,
          ArenaAllocator *allocator)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocator *allocator_local;
  SymbolType type_local;
  PropertyName name_local;
  AsmJsFunctionDeclaration *this_local;
  
  AsmJsSymbol::AsmJsSymbol(&this->super_AsmJsSymbol,name,type);
  (this->super_AsmJsSymbol)._vptr_AsmJsSymbol = (_func_int **)&PTR_GetType_01df2f20;
  AsmJsRetType::AsmJsRetType((AsmJsRetType *)&(this->super_AsmJsSymbol).field_0x14,Void);
  this->mArgCount = 0xffff;
  this->mLocation = 0;
  this->mArgumentsType = (AsmJsType *)0x0;
  this->field_0x28 = this->field_0x28 & 0xfe;
  this->mAllocator = allocator;
  bVar2 = Is(&this->super_AsmJsSymbol);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x1cb,"(AsmJsFunctionDeclaration::Is(this))",
                                "AsmJsFunctionDeclaration::Is(this)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

AsmJsFunctionDeclaration::AsmJsFunctionDeclaration(PropertyName name, AsmJsSymbol::SymbolType type, ArenaAllocator* allocator) :
        AsmJsSymbol(name, type)
        , mAllocator(allocator)
        , mReturnType(AsmJsRetType::Void)
        , mArgCount(Constants::InvalidArgSlot)
        , mLocation(0)
        , mReturnTypeKnown(false)
        , mArgumentsType(nullptr)
    {
        Assert(AsmJsFunctionDeclaration::Is(this));
    }